

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_slot_management.c
# Opt level: O2

void mbedtls_psa_get_stats(mbedtls_psa_stats_t *stats)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  size_t sVar7;
  uint uVar8;
  
  stats->cache_slots = 0;
  stats->empty_slots = 0;
  stats->external_slots = 0;
  stats->half_filled_slots = 0;
  stats->volatile_slots = 0;
  stats->persistent_slots = 0;
  stats->max_open_internal_key_id = 0;
  stats->max_open_external_key_id = 0;
  sVar2 = 0;
  uVar6 = 0;
  sVar4 = 0;
  sVar5 = 0;
  uVar8 = 0;
  sVar7 = 0;
  for (lVar3 = 8; lVar3 != 0x608; lVar3 = lVar3 + 0x30) {
    if (*(short *)(&global_data.field_0x570 + lVar3) == 0) {
      sVar2 = sVar2 + 1;
      stats->empty_slots = sVar2;
    }
    else if (*(int *)(&global_data.field_0x574 + lVar3) == 1) {
      uVar1 = *(uint *)((long)&global_data.key_slots[0].attr.type + lVar3);
      sVar7 = sVar7 + 1;
      stats->persistent_slots = sVar7;
      if (uVar8 < uVar1) {
        stats->max_open_internal_key_id = uVar1;
        uVar8 = uVar1;
      }
    }
    else if (*(int *)(&global_data.field_0x574 + lVar3) == 0) {
      sVar5 = sVar5 + 1;
      stats->volatile_slots = sVar5;
    }
    else {
      uVar1 = *(uint *)((long)&global_data.key_slots[0].attr.type + lVar3);
      sVar4 = sVar4 + 1;
      stats->external_slots = sVar4;
      if (uVar6 < uVar1) {
        stats->max_open_external_key_id = uVar1;
        uVar6 = uVar1;
      }
    }
  }
  return;
}

Assistant:

void mbedtls_psa_get_stats( mbedtls_psa_stats_t *stats )
{
    psa_key_handle_t key;
    memset( stats, 0, sizeof( *stats ) );
    for( key = 1; key <= PSA_KEY_SLOT_COUNT; key++ )
    {
        const psa_key_slot_t *slot = &global_data.key_slots[key - 1];
        if( ! psa_is_key_slot_occupied( slot ) )
        {
            ++stats->empty_slots;
            continue;
        }
        if( slot->attr.lifetime == PSA_KEY_LIFETIME_VOLATILE )
            ++stats->volatile_slots;
        else if( slot->attr.lifetime == PSA_KEY_LIFETIME_PERSISTENT )
        {
            psa_app_key_id_t id = PSA_KEY_FILE_GET_KEY_ID(slot->attr.id);
            ++stats->persistent_slots;
            if( id > stats->max_open_internal_key_id )
                stats->max_open_internal_key_id = id;
        }
        else
        {
            psa_app_key_id_t id = PSA_KEY_FILE_GET_KEY_ID(slot->attr.id);
            ++stats->external_slots;
            if( id > stats->max_open_external_key_id )
                stats->max_open_external_key_id = id;
        }
    }
}